

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O1

CURLcode Curl_cshutdn_add_pollfds(cshutdn *cshutdn,Curl_easy *data,curl_pollfds *cpfds)

{
  CURLcode CVar1;
  Curl_llist_node *pCVar2;
  connectdata *conn;
  easy_pollset ps;
  easy_pollset local_58;
  
  pCVar2 = Curl_llist_head(&cshutdn->list);
  if (pCVar2 != (Curl_llist_node *)0x0) {
    for (pCVar2 = Curl_llist_head(&cshutdn->list); pCVar2 != (Curl_llist_node *)0x0;
        pCVar2 = Curl_node_next(pCVar2)) {
      conn = (connectdata *)Curl_node_elem(pCVar2);
      local_58.sockets[0] = 0;
      local_58.sockets[1] = 0;
      local_58.sockets[2] = 0;
      local_58.sockets[3] = 0;
      local_58.sockets[4] = 0;
      local_58.num = 0;
      local_58.actions[0] = '\0';
      local_58.actions[1] = '\0';
      local_58.actions[2] = '\0';
      local_58.actions[3] = '\0';
      local_58.actions[4] = '\0';
      local_58._29_3_ = 0;
      Curl_attach_connection(data,conn);
      Curl_conn_adjust_pollset(data,conn,&local_58);
      Curl_detach_connection(data);
      CVar1 = Curl_pollfds_add_ps(cpfds,&local_58);
      if (CVar1 != CURLE_OK) {
        Curl_pollfds_cleanup(cpfds);
        return CVar1;
      }
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_cshutdn_add_pollfds(struct cshutdn *cshutdn,
                                  struct Curl_easy *data,
                                  struct curl_pollfds *cpfds)
{
  CURLcode result = CURLE_OK;

  if(Curl_llist_head(&cshutdn->list)) {
    struct Curl_llist_node *e;
    struct easy_pollset ps;
    struct connectdata *conn;

    for(e = Curl_llist_head(&cshutdn->list); e;
        e = Curl_node_next(e)) {
      conn = Curl_node_elem(e);
      memset(&ps, 0, sizeof(ps));
      Curl_attach_connection(data, conn);
      Curl_conn_adjust_pollset(data, conn, &ps);
      Curl_detach_connection(data);

      result = Curl_pollfds_add_ps(cpfds, &ps);
      if(result) {
        Curl_pollfds_cleanup(cpfds);
        goto out;
      }
    }
  }
out:
  return result;
}